

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.h
# Opt level: O0

void __thiscall psy::C::TypeCheckerTester::~TypeCheckerTester(TypeCheckerTester *this)

{
  TypeCheckerTester *this_local;
  
  ~TypeCheckerTester(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

TypeCheckerTester(TestSuite* suite)
        : Tester(suite)
    {}